

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::ScanInitialImplicitRoots(HeapInfo *this)

{
  SmallNormalHeapBlock *this_00;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  SmallFinalizableWithBarrierHeapBlock *this_02;
  SmallFinalizableHeapBlock *this_03;
  MediumNormalHeapBlock *this_04;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_05;
  MediumFinalizableWithBarrierHeapBlock *this_06;
  MediumFinalizableHeapBlock *this_07;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar1;
  
  for (lVar1 = 0x78; lVar1 != 0xa878; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),this->recycler);
  }
  for (lVar1 = 0xa878; lVar1 != 0x10df8; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),this->recycler);
  }
  LargeHeapBucket::ScanInitialImplicitRoots(&this->largeObjectBucket,this->recycler);
  for (this_00 = this->newNormalHeapBlockList;
      this_00 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_00 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_00)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_00,this->recycler);
  }
  for (this_01 = &this->newNormalWithBarrierHeapBlockList->
                  super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
      this_01 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_01 = &SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                            this_01)->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_01,this->recycler);
  }
  for (this_02 = this->newFinalizableWithBarrierHeapBlockList;
      this_02 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_02 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                          (this_02)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_02,this->recycler);
  }
  for (this_03 = this->newFinalizableHeapBlockList;
      this_03 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_03 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_03)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_03->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
  }
  for (this_04 = this->newMediumNormalHeapBlockList;
      this_04 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_04 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_04)) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_04,this->recycler);
  }
  for (this_05 = &this->newMediumNormalWithBarrierHeapBlockList->
                  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
      this_05 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_05 = &SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                            this_05)->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>)
  {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_05,this->recycler);
  }
  for (this_06 = this->newMediumFinalizableWithBarrierHeapBlockList;
      this_06 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_06 = SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                          (this_06)) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_06,this->recycler);
  }
  for (this_07 = this->newMediumFinalizableHeapBlockList;
      this_07 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_07 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_07))
  {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_07->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
  }
  return;
}

Assistant:

void
HeapInfo::ScanInitialImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanInitialImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

}